

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

_Bool section_covers_addr(MemoryRegionSection *section,hwaddr addr)

{
  bool bVar1;
  
  bVar1 = true;
  if (*(long *)((long)&section->size + 8) == 0) {
    bVar1 = addr <= ((long)section->size + section->offset_within_address_space) - 1 &&
            section->offset_within_address_space <= addr;
  }
  return bVar1;
}

Assistant:

static inline bool section_covers_addr(const MemoryRegionSection *section,
                                       hwaddr addr)
{
    /* Memory topology clips a memory region to [0, 2^64); size.hi > 0 means
     * the section must cover the entire address space.
     */
    return int128_gethi(section->size) ||
           range_covers_byte(section->offset_within_address_space,
                             int128_getlo(section->size), addr);
}